

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_svd_t * matd_svd_flags(matd_svd_t *__return_storage_ptr__,matd_t *A,int flags)

{
  matd_t *pmVar1;
  undefined1 local_50 [8];
  matd_svd_t tmp;
  matd_t *At;
  matd_t *local_28;
  matd_t *local_20;
  int local_14;
  matd_t *pmStack_10;
  int flags_local;
  matd_t *A_local;
  
  local_14 = flags;
  pmStack_10 = A;
  if (A->nrows < A->ncols) {
    tmp.V = matd_transpose(A);
    matd_svd_tall((matd_svd_t *)local_50,tmp.V,local_14);
    memset(__return_storage_ptr__,0,0x18);
    __return_storage_ptr__->U = tmp.S;
    pmVar1 = matd_transpose(tmp.U);
    __return_storage_ptr__->S = pmVar1;
    __return_storage_ptr__->V = (matd_t *)local_50;
    matd_destroy(tmp.U);
    matd_destroy(tmp.V);
  }
  else {
    matd_svd_tall((matd_svd_t *)&At,A,flags);
    __return_storage_ptr__->U = At;
    __return_storage_ptr__->S = local_28;
    __return_storage_ptr__->V = local_20;
  }
  return __return_storage_ptr__;
}

Assistant:

matd_svd_t matd_svd_flags(matd_t *A, int flags)
{
    matd_svd_t res;

    if (A->ncols <= A->nrows) {
        res = matd_svd_tall(A, flags);
    } else {
        matd_t *At = matd_transpose(A);

        // A =U  S  V'
        // A'=V  S' U'

        matd_svd_t tmp = matd_svd_tall(At, flags);

        memset(&res, 0, sizeof(res));
        res.U = tmp.V; //matd_transpose(tmp.V);
        res.S = matd_transpose(tmp.S);
        res.V = tmp.U; //matd_transpose(tmp.U);

        matd_destroy(tmp.S);
        matd_destroy(At);
    }

/*
  matd_t *check = matd_op("M*M*M'-M", res.U, res.S, res.V, A);
  double maxerr = 0;

  for (int i = 0; i < check->nrows; i++)
  for (int j = 0; j < check->ncols; j++)
  maxerr = fmax(maxerr, fabs(MATD_EL(check, i, j)));

  matd_destroy(check);

  if (maxerr > 1e-7) {
  printf("bad maxerr: %15f\n", maxerr);
  }

  if (maxerr > 1e-5) {
  printf("bad maxerr: %15f\n", maxerr);
  matd_print(A, "%15f");
  assert(0);
  }

*/
    return res;
}